

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O3

void __thiscall USBControlTransferParser::ParseStandardDescriptor(USBControlTransferParser *this)

{
  pointer puVar1;
  USBDescriptorType UVar2;
  int iVar3;
  mapped_type *pmVar4;
  int iVar5;
  USBStructField *descFields;
  unsigned_long_long local_40;
  unsigned_long_long local_38;
  ulong local_30;
  char *local_28;
  undefined2 local_20;
  
  UVar2 = this->mDescType;
  switch(UVar2) {
  case DT_DEVICE:
    descFields = DeviceDescriptorFields;
    break;
  case DT_CONFIGURATION:
  case DT_OTHER_SPEED_CONFIGURATION:
    descFields = ConfigurationDescriptorFields;
    break;
  case DT_STRING:
    goto switchD_00135da5_caseD_3;
  case DT_INTERFACE:
    descFields = InterfaceDescriptorFields;
    break;
  case DT_ENDPOINT:
    descFields = EndpointDescriptorFields;
    break;
  case DT_DEVICE_QUALIFIER:
    descFields = DeviceQualifierDescriptorFields;
    break;
  default:
    if (UVar2 == DT_HID) {
      pmVar4 = std::
               map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
               ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber);
      if (*pmVar4 == CC_HID) {
        descFields = HIDDescriptorFields;
        break;
      }
      UVar2 = this->mDescType;
    }
switchD_00135da5_caseD_3:
    if (UVar2 != DT_CDC_CS_INTERFACE) {
      if (UVar2 != DT_CDC_CS_ENDPOINT) goto LAB_00135e48;
      pmVar4 = std::
               map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
               ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber);
      if ((*pmVar4 != CC_CommunicationsAndCDCControl) &&
         (pmVar4 = std::
                   map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                   ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber),
         *pmVar4 != CC_CDCData)) goto LAB_00135e48;
    }
    if (0x10 < (ulong)this->mDescSubtype) goto LAB_00135e48;
    descFields = (USBStructField *)(&PTR_CDCHeaderFields_0015a6d8)[this->mDescSubtype];
  }
  ParseStructure(this,descFields);
LAB_00135e48:
  iVar3 = this->mDescBytes;
  iVar5 = this->mParsedOffset;
  if ((iVar5 < iVar3) && (this->mPacketOffset < this->mPacketDataBytes)) {
    do {
      Frame::Frame((Frame *)&local_40);
      local_20 = 0xd;
      puVar1 = (this->pPacket->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = this->mPacketOffset;
      local_40 = puVar1[iVar3 * 8 + 0x10];
      local_38 = puVar1[iVar3 * 8 + 0x18];
      local_30 = (ulong)this->mAddress << 0x30 |
                 (ulong)(this->pPacket->mData).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar3 + 2] | 0x100000000;
      local_28 = "byte";
      AnalyzerResults::AddFrame((Frame *)this->pResults);
      this->mPacketOffset = this->mPacketOffset + 1;
      this->mParsedOffset = this->mParsedOffset + 1;
      Frame::~Frame((Frame *)&local_40);
      iVar3 = this->mDescBytes;
      iVar5 = this->mParsedOffset;
      if (iVar3 <= iVar5) break;
    } while (this->mPacketOffset < this->mPacketDataBytes);
  }
  if (iVar3 == iVar5) {
    this->mParsedOffset = 0;
    this->mDescType = DT_Undefined;
  }
  return;
}

Assistant:

void USBControlTransferParser::ParseStandardDescriptor()
{
    USBStructField* descFields = NULL;
    if( mDescType == DT_DEVICE )
        descFields = DeviceDescriptorFields;
    else if( mDescType == DT_DEVICE_QUALIFIER )
        descFields = DeviceQualifierDescriptorFields;
    else if( mDescType == DT_CONFIGURATION || mDescType == DT_OTHER_SPEED_CONFIGURATION )
        descFields = ConfigurationDescriptorFields;
    else if( mDescType == DT_INTERFACE )
        descFields = InterfaceDescriptorFields;
    else if( mDescType == DT_ENDPOINT )
        descFields = EndpointDescriptorFields;
    else if( mDescType == DT_HID && mInterfaceClasses[ mInterfaceNumber ] == CC_HID )
        descFields = HIDDescriptorFields;
    else if( mDescType == DT_CDC_CS_INTERFACE ||
             mDescType == DT_CDC_CS_ENDPOINT && ( mInterfaceClasses[ mInterfaceNumber ] == CC_CommunicationsAndCDCControl ||
                                                  mInterfaceClasses[ mInterfaceNumber ] == CC_CDCData ) )
    {
        if( mDescSubtype == DST_HEADER )
            descFields = CDCHeaderFields;
        else if( mDescSubtype == DST_CALL_MANAGEMENT )
            descFields = CDCCallManagementFields;
        else if( mDescSubtype == DST_ABSTRACT_CONTROL_MANAGEMENT )
            descFields = CDCAbstractControlManagementFields;
        else if( mDescSubtype == DST_DIRECT_LINE_MANAGEMENT )
            descFields = CDCDirectLineManagementFields;
        else if( mDescSubtype == DST_TELEPHONE_RINGER )
            descFields = CDCTelephoneRingerFields;
        else if( mDescSubtype == DST_TELEPHONE_CALL_AND_LINE_STATE )
            descFields = CDCTelephoneCallStateReportingFields;
        else if( mDescSubtype == DST_UNION )
            descFields = CDCUnionFields;
        else if( mDescSubtype == DST_COUNTRY_SELECTION )
            descFields = CDCCountrySelectionFields;
        else if( mDescSubtype == DST_TELEPHONE_OPERATIONAL_MODES )
            descFields = CDCTelephoneOperationalModesFields;
        else if( mDescSubtype == DST_USB_TERMINAL )
            descFields = CDCUSBTerminalFields;
        else if( mDescSubtype == DST_NETWORK_CHANNEL_TERMINAL )
            descFields = CDCNetworkChannelTerminalFields;
        else if( mDescSubtype == DST_PROTOCOL_UNIT )
            descFields = CDCProtocolUnitFields;
        else if( mDescSubtype == DST_EXTENSION_UNIT )
            descFields = CDCExtensionUnitFields;
        else if( mDescSubtype == DST_MULTI_CHANNEL_MANAGEMENT )
            descFields = CDCMultiChannelFields;
        else if( mDescSubtype == DST_CAPI_CONTROL_MANAGEMENT )
            descFields = CDCCAPIControlFields;
        else if( mDescSubtype == DST_ETHERNET_NETWORKING )
            descFields = CDCEthernetNetworkingFields;
        else if( mDescSubtype == DST_ATM_NETWORKING )
            descFields = CDCATMNetworkingFields;
    }

    if( descFields )
        ParseStructure( descFields );

    // parse the rest of the descriptor or packet as raw bytes

    while( mDescBytes > mParsedOffset            // more bytes in descriptor?
           && mPacketDataBytes > mPacketOffset ) // more data in packet?
    {
        USBCtrlTransFieldFrame f;
        f.mFlags = FF_None;
        f.mStartingSampleInclusive = *( pPacket->mBitBeginSamples.begin() + ( mPacketOffset + 2 ) * 8 );
        f.mEndingSampleInclusive = *( pPacket->mBitBeginSamples.begin() + ( mPacketOffset + 3 ) * 8 );

        f.PackFrame( pPacket->mData[ mPacketOffset + 2 ], 1, mAddress, Fld_None, "byte" );

        pResults->AddFrame( f );

        ++mPacketOffset;
        ++mParsedOffset;
    }

    // reset the parser if we have completeted parsing the descriptor
    if( mDescBytes == mParsedOffset )
    {
        mParsedOffset = 0;
        mDescType = DT_Undefined;
    }
}